

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cc
# Opt level: O2

void absl::anon_unknown_0::AppendNumberUnit(string *out,double n,DisplayUnit unit)

{
  char cVar1;
  char *pcVar2;
  char *__s;
  undefined1 *__n;
  int width;
  long v;
  double dVar3;
  double d;
  char buf [15];
  
  width = 0xf;
  if (unit.prec < 0xf) {
    width = unit.prec;
  }
  d = 0.0;
  dVar3 = modf(n,&d);
  dVar3 = dVar3 * unit.pow10;
  if (0.0 <= dVar3) {
    dVar3 = floor(dVar3 + 0.5);
  }
  else {
    dVar3 = ceil(dVar3 + -0.5);
  }
  v = (long)dVar3;
  if ((long)d != 0 || v != 0) {
    pcVar2 = Format64(&stack0xffffffffffffffd8,0,(long)d);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (out,pcVar2,(long)&stack0xffffffffffffffd8 - (long)pcVar2);
    if (v != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (out,'.');
      __s = Format64(&stack0xffffffffffffffd8,width,v);
      __n = &stack0xffffffffffffffd9 + -(long)__s;
      pcVar2 = buf + 0xe;
      do {
        __n = __n + -1;
        cVar1 = *pcVar2;
        pcVar2 = pcVar2 + -1;
      } while (cVar1 == '0');
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (out,__s,(size_type)__n);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (out,unit.abbr._M_str,unit.abbr._M_len);
  }
  return;
}

Assistant:

void AppendNumberUnit(std::string* out, double n, DisplayUnit unit) {
  constexpr int kBufferSize = std::numeric_limits<double>::digits10;
  const int prec = std::min(kBufferSize, unit.prec);
  char buf[kBufferSize];  // also large enough to hold integer part
  char* ep = buf + sizeof(buf);
  double d = 0;
  int64_t frac_part = Round(std::modf(n, &d) * unit.pow10);
  int64_t int_part = d;
  if (int_part != 0 || frac_part != 0) {
    char* bp = Format64(ep, 0, int_part);  // always < 1000
    out->append(bp, ep - bp);
    if (frac_part != 0) {
      out->push_back('.');
      bp = Format64(ep, prec, frac_part);
      while (ep[-1] == '0') --ep;
      out->append(bp, ep - bp);
    }
    out->append(unit.abbr.data(), unit.abbr.size());
  }
}